

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::tryParsingType(StructuralParser *this,ParseTypeContext parseContext)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Op op;
  ConcreteType *pCVar4;
  Expression *pEVar5;
  TypeMetaFunction *pTVar6;
  QualifiedIdentifier *qi;
  ParseTypeContext in_EDX;
  undefined4 in_register_00000034;
  StructuralParser *this_00;
  char (*in_R9) [25];
  Context context;
  Context local_1c8;
  Type local_1b0;
  Type local_198;
  Type local_180;
  Type local_168;
  Type local_150;
  Type local_138;
  Type local_120;
  Type local_108;
  Type local_f0;
  Type local_d8;
  Type local_c0;
  Type local_a8;
  CompileMessage local_90;
  CompileMessage local_58;
  
  this_00 = (StructuralParser *)CONCAT44(in_register_00000034,parseContext);
  local_1c8.location.sourceCode.object = (this_00->super_SOULTokeniser).location.sourceCode.object;
  if (local_1c8.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_1c8.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_1c8.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_1c8.location.location.data = (this_00->super_SOULTokeniser).location.location.data;
  local_1c8.parentScope = this_00->currentScope;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27dafb);
  if (bVar2) {
    local_a8.category = primitive;
    local_a8.arrayElementCategory = invalid;
    local_a8.isRef = false;
    local_a8.isConstant = false;
    local_a8.primitiveType.type = float32;
    local_a8.boundingSize = 0;
    local_a8.arrayElementBoundingSize = 0;
    local_a8.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_a8);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_a8.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e242);
  if (bVar2) {
    local_c0.category = primitive;
    local_c0.arrayElementCategory = invalid;
    local_c0.isRef = false;
    local_c0.isConstant = false;
    local_c0.primitiveType.type = float32;
    local_c0.boundingSize = 0;
    local_c0.arrayElementBoundingSize = 0;
    local_c0.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_c0);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_c0.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e259);
  if (bVar2) {
    local_d8.category = primitive;
    local_d8.arrayElementCategory = invalid;
    local_d8.isRef = false;
    local_d8.isConstant = false;
    local_d8.primitiveType.type = float64;
    local_d8.boundingSize = 0;
    local_d8.arrayElementBoundingSize = 0;
    local_d8.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_d8);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_d8.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e1ad);
  if (bVar2) {
    local_f0.category = primitive;
    local_f0.arrayElementCategory = invalid;
    local_f0.isRef = false;
    local_f0.isConstant = false;
    local_f0.primitiveType.type = void_;
    local_f0.boundingSize = 0;
    local_f0.arrayElementBoundingSize = 0;
    local_f0.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_f0);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2a0d83);
  if (bVar2) {
    local_108.category = primitive;
    local_108.arrayElementCategory = invalid;
    local_108.isRef = false;
    local_108.isConstant = false;
    local_108.primitiveType.type = int32;
    local_108.boundingSize = 0;
    local_108.arrayElementBoundingSize = 0;
    local_108.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_108);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_108.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e217);
  if (bVar2) {
    local_120.category = primitive;
    local_120.arrayElementCategory = invalid;
    local_120.isRef = false;
    local_120.isConstant = false;
    local_120.primitiveType.type = int32;
    local_120.boundingSize = 0;
    local_120.arrayElementBoundingSize = 0;
    local_120.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_120);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_120.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e22d);
  if (bVar2) {
    local_138.category = primitive;
    local_138.arrayElementCategory = invalid;
    local_138.isRef = false;
    local_138.isConstant = false;
    local_138.primitiveType.type = int64;
    local_138.boundingSize = 0;
    local_138.arrayElementBoundingSize = 0;
    local_138.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_138);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_138.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e270);
  if (bVar2) {
    local_150.category = primitive;
    local_150.arrayElementCategory = invalid;
    local_150.isRef = false;
    local_150.isConstant = false;
    local_150.primitiveType.type = bool_;
    local_150.boundingSize = 0;
    local_150.arrayElementBoundingSize = 0;
    local_150.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_150);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_150.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27d5c4);
  if (bVar2) {
    local_168.category = primitive;
    local_168.arrayElementCategory = invalid;
    local_168.isRef = false;
    local_168.isConstant = false;
    local_168.primitiveType.type = complex32;
    local_168.boundingSize = 0;
    local_168.arrayElementBoundingSize = 0;
    local_168.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_168);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_168.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27d07d);
  if (bVar2) {
    local_180.category = primitive;
    local_180.arrayElementCategory = invalid;
    local_180.isRef = false;
    local_180.isConstant = false;
    local_180.primitiveType.type = complex32;
    local_180.boundingSize = 0;
    local_180.arrayElementBoundingSize = 0;
    local_180.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_180);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_180.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27d087);
  if (bVar2) {
    local_198.category = primitive;
    local_198.arrayElementCategory = invalid;
    local_198.isRef = false;
    local_198.isConstant = false;
    local_198.primitiveType.type = complex64;
    local_198.boundingSize = 0;
    local_198.arrayElementBoundingSize = 0;
    local_198.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_198);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_198.structure.object);
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x27e2a2);
  if (bVar2) {
    local_1b0.category = stringLiteral;
    local_1b0._1_8_ = 0;
    local_1b0._9_7_ = 0;
    local_1b0.structure.object._0_1_ = 0;
    local_1b0.structure.object._1_7_ = 0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1c8,&local_1b0);
    pEVar5 = parseArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)
               CONCAT71(local_1b0.structure.object._1_7_,local_1b0.structure.object._0_1_));
    goto LAB_001f3587;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x29f85a);
  if (bVar2) {
    if (in_EDX == structMember) {
      CompileMessageHelpers::createMessage<>
                (&local_90,syntax,error,"Struct members cannot be declared const");
      (*(this_00->super_SOULTokeniser)._vptr_Tokeniser[2])(this_00,&local_90);
      CompileMessage::~CompileMessage(&local_90);
    }
    pEVar5 = parseType(this_00,in_EDX);
    local_90.description._M_dataplus._M_p._0_4_ = 2;
    pTVar6 = PoolAllocator::
             allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op>
                       (&this_00->allocator->pool,&local_1c8,pEVar5,(Op *)&local_90);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)this_00,(TokenType)0x27d077);
    if (bVar2) {
      CompileMessageHelpers::createMessage<char_const(&)[25]>
                (&local_58,(CompileMessageHelpers *)0x1,none,0x27e09f,"Fixed point type support",
                 in_R9);
      AST::Context::throwError(&local_1c8,&local_58,false);
    }
    pcVar1 = (this_00->super_SOULTokeniser).currentType.text;
    if (pcVar1 != "$identifier") {
      if (pcVar1 != (char *)0x0) {
        iVar3 = strcmp(pcVar1,"$identifier");
        if (iVar3 == 0) goto LAB_001f3524;
      }
      (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
      goto LAB_001f3587;
    }
LAB_001f3524:
    qi = parseQualifiedIdentifier(this_00);
    op = getOpForTypeMetaFunctionName(qi);
    if ((op == none) ||
       ((pcVar1 = (this_00->super_SOULTokeniser).currentType.text, pcVar1 != "(" &&
        (((pcVar1 == (char *)0x0 || (*pcVar1 != '(')) || (pcVar1[1] != '\0')))))) {
      pTVar6 = (TypeMetaFunction *)
               parseVectorOrArrayTypeSuffixes(this_00,&qi->super_Expression,in_EDX);
    }
    else {
      pTVar6 = parseTypeMetaFunction(this_00,&local_1c8,op);
      pTVar6 = (TypeMetaFunction *)
               parseVectorOrArrayTypeSuffixes(this_00,&pTVar6->super_Expression,in_EDX);
    }
  }
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pTVar6;
LAB_001f3587:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1c8.location.sourceCode.object);
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> tryParsingType (ParseTypeContext parseContext)
    {
        auto context = getContext();

        if (matchIf (Keyword::float_))    return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float32),  parseContext);
        if (matchIf (Keyword::float32))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float32),  parseContext);
        if (matchIf (Keyword::float64))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float64),  parseContext);
        if (matchIf (Keyword::void_))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::void_),    parseContext);
        if (matchIf (Keyword::int_))      return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int32),    parseContext);
        if (matchIf (Keyword::int32))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int32),    parseContext);
        if (matchIf (Keyword::int64))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int64),    parseContext);
        if (matchIf (Keyword::bool_))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::bool_),    parseContext);
        if (matchIf (Keyword::complex))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex32),  parseContext);
        if (matchIf (Keyword::complex32)) return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex32),  parseContext);
        if (matchIf (Keyword::complex64)) return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex64),  parseContext);
        if (matchIf (Keyword::string))    return parseArrayTypeSuffixes (createConcreteType (context, Type::createStringLiteral()), parseContext);

        if (matchIf (Keyword::const_))
        {
            if (parseContext == ParseTypeContext::structMember)
                throwError (Errors::memberCannotBeConst());

            auto& type = parseType (parseContext);
            return allocate<AST::TypeMetaFunction> (context, type, AST::TypeMetaFunction::Op::makeConst);
        }

        if (matchIf (Keyword::fixed))
        {
            context.throwError (Errors::notYetImplemented ("Fixed point type support"));
            return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::fixed), parseContext);
        }

        if (matches (Token::identifier))
        {
            auto& qi = parseQualifiedIdentifier();
            auto metaTypeOp = getOpForTypeMetaFunctionName (qi);

            if (metaTypeOp != AST::TypeMetaFunction::Op::none && matches (Operator::openParen))
                return parseVectorOrArrayTypeSuffixes (parseTypeMetaFunction (context, metaTypeOp), parseContext);

            return parseVectorOrArrayTypeSuffixes (qi, parseContext);
        }

        return {};
    }